

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

void __thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Core,_helics::CoreType>::SearchableObjectHolder
          (SearchableObjectHolder<helics::Core,_helics::CoreType> *this)

{
  _Rb_tree_header *p_Var1;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  *(undefined8 *)((long)&(this->mapLock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mapLock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mapLock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mapLock).super___mutex_base._M_mutex + 8) = 0;
  (this->mapLock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  p_Var1 = &(this->objectMap)._M_t._M_impl.super__Rb_tree_header;
  (this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->objectMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->typeMap)._M_t._M_impl.super__Rb_tree_header;
  (this->typeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->typeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->typeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->typeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->typeMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  TripWire::getLine();
  (this->trippedDetect).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
  (this->trippedDetect).lineDetector.
  super___shared_ptr<const_std::atomic<bool>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_20;
  return;
}

Assistant:

SearchableObjectHolder() = default;